

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

int Ivy_ManSetLevels(Ivy_Man_t *p,int fHaig)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  void *pvVar4;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *p_00;
  uint uVar5;
  int iVar6;
  
  if (fHaig != 0) {
    for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
      puVar3 = (uint *)Vec_PtrEntry(p->vObjs,iVar6);
      if (puVar3 != (uint *)0x0) {
        if ((((puVar3[2] & 0xf) == 4) || ((puVar3[2] & 0xf) == 1)) &&
           (*(long *)(puVar3 + 0x12) != 0)) {
          printf("CI %d has a choice, which will not be visualized.\n",(ulong)*puVar3);
        }
      }
    }
  }
  iVar6 = 0;
  while( true ) {
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
    if (iVar1 <= iVar6) break;
    pvVar4 = Vec_PtrEntry(p_00,iVar6);
    if (pvVar4 != (void *)0x0) {
      *(uint *)((long)pvVar4 + 8) = *(uint *)((long)pvVar4 + 8) & 0x7ff;
    }
    iVar6 = iVar6 + 1;
  }
  uVar5 = 0;
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p_00,iVar6);
    if ((pvVar4 != (void *)0x0) &&
       ((uVar2 = *(uint *)((long)pvVar4 + 8) & 0xf, uVar2 == 4 || (uVar2 == 2)))) {
      Ivy_ManSetLevels_rec
                ((Ivy_Obj_t *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe),fHaig);
      uVar2 = *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 8) >> 0xb;
      if (uVar5 <= uVar2) {
        uVar5 = uVar2;
      }
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p_00,iVar6);
    if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xf) - 5 < 3)) &&
       (pObj->nRefs == 0)) {
      Ivy_ManSetLevels_rec(pObj,fHaig);
      uVar2 = *(uint *)&pObj->field_0x8 >> 0xb;
      if (uVar5 <= uVar2) {
        uVar5 = uVar2;
      }
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p_00,iVar6);
    if (pvVar4 != (void *)0x0) {
      *(byte *)((long)pvVar4 + 8) = *(byte *)((long)pvVar4 + 8) & 0xef;
    }
    p_00 = p->vObjs;
    iVar1 = p_00->nSize;
  }
  return uVar5;
}

Assistant:

int Ivy_ManSetLevels( Ivy_Man_t * p, int fHaig )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax;
    // check if CIs have choices
    if ( fHaig )
    {
        Ivy_ManForEachCi( p, pObj, i )
            if ( pObj->pEquiv )
                printf( "CI %d has a choice, which will not be visualized.\n", pObj->Id );
    }
    // clean the levels
    Ivy_ManForEachObj( p, pObj, i )
        pObj->Level = 0;
    // compute the levels
    LevelMax = 0;
    Ivy_ManForEachCo( p, pObj, i )
    {
        Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    }
    // compute levels of nodes without fanout
    Ivy_ManForEachObj( p, pObj, i )
        if ( (Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)) && Ivy_ObjRefs(pObj) == 0 )
        {
            Ivy_ManSetLevels_rec( pObj, fHaig );
            LevelMax = IVY_MAX( LevelMax, (int)pObj->Level );
        }
    // clean the marks
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    return LevelMax;
}